

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_show_colormap.cxx
# Opt level: O2

void __thiscall ColorMenu::drawbox(ColorMenu *this,Fl_Color c)

{
  int iVar1;
  int iVar2;
  Fl_Boxtype t;
  int iStack_8;
  
  if (0xff < c) {
    return;
  }
  iVar2 = (c & 7) * 0xe;
  iVar1 = (c >> 3) * 0xe;
  if (this->which == c) {
    iVar2 = iVar2 + 5;
    iVar1 = iVar1 + 5;
    t = FL_DOWN_BOX;
    iStack_8 = 0xd;
  }
  else {
    iVar1 = iVar1 + 4;
    iVar2 = iVar2 + 4;
    t = FL_BORDER_BOX;
    iStack_8 = 0xf;
  }
  fl_draw_box(t,iVar2,iVar1,iStack_8,iStack_8,c);
  return;
}

Assistant:

void ColorMenu::drawbox(Fl_Color c) {
  if (c > 255) return;
  int X = (c%8)*BOXSIZE+BORDER;
  int Y = (c/8)*BOXSIZE+BORDER;
#if BORDER_WIDTH < 3
  if (c == which) fl_draw_box(FL_DOWN_BOX, X+1, Y+1, BOXSIZE-1, BOXSIZE-1, c);
  else fl_draw_box(FL_BORDER_BOX, X, Y, BOXSIZE+1, BOXSIZE+1, c);
#else
  fl_draw_box(c == which ? FL_DOWN_BOX : FL_BORDER_BOX,
	      X, Y, BOXSIZE+1, BOXSIZE+1, c);
#endif
}